

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.c
# Opt level: O0

int mixed_make_segment_compressor(uint32_t samplerate,mixed_segment *segment)

{
  compressor_segment_data *data_00;
  compressor_segment_data *data;
  mixed_segment *segment_local;
  uint32_t samplerate_local;
  
  data_00 = (compressor_segment_data *)(*mixed_calloc)(1,0x10a0);
  if (data_00 != (compressor_segment_data *)0x0) {
    data_00->samplerate = samplerate;
    data_00->pregain = 0.0;
    data_00->threshold = -24.0;
    data_00->knee = 30.0;
    data_00->ratio = 12.0;
    data_00->attack = 0.003;
    data_00->release = 0.25;
    data_00->predelay = 0.006;
    data_00->releasezone[0] = 0.09;
    data_00->releasezone[1] = 0.16;
    data_00->releasezone[2] = 0.42;
    data_00->releasezone[3] = 0.96;
    data_00->postgain = 0.0;
    data_00->wet = 1.0;
    compressor_reinit(data_00);
    segment->start = compressor_segment_start;
    segment->mix = (_func_int_mixed_segment_ptr *)&LAB_001050e0;
    segment->set_in = compressor_segment_set_in;
    segment->set_out = compressor_segment_set_out;
    segment->info = compressor_segment_info;
    segment->get = compressor_segment_get;
    segment->set = compressor_segment_set;
    segment->data = data_00;
  }
  else {
    mixed_err(1);
  }
  segment_local._4_4_ = (uint)(data_00 != (compressor_segment_data *)0x0);
  return segment_local._4_4_;
}

Assistant:

MIXED_EXPORT int mixed_make_segment_compressor(uint32_t samplerate, struct mixed_segment *segment){
  struct compressor_segment_data *data = mixed_calloc(1, sizeof(struct compressor_segment_data));
  if(!data){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }

  data->samplerate = samplerate;
  data->pregain = 0.0;
  data->threshold = -24;
  data->knee = 30;
  data->ratio = 12;
  data->attack = 0.003;
  data->release = 0.25;
  data->predelay = 0.006;
  data->releasezone[0] = 0.09;
  data->releasezone[1] = 0.16;
  data->releasezone[2] = 0.42;
  data->releasezone[3] = 0.96;
  data->postgain = 0;
  data->wet = 1;

  compressor_reinit(data);
  
  segment->start = compressor_segment_start;
  segment->mix = compressor_segment_mix;
  segment->set_in = compressor_segment_set_in;
  segment->set_out = compressor_segment_set_out;
  segment->info = compressor_segment_info;
  segment->get = compressor_segment_get;
  segment->set = compressor_segment_set;
  segment->data = data;
  return 1;
}